

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlAddPrevSibling(xmlNodePtr next,xmlNodePtr cur)

{
  xmlNodePtr cur_local;
  xmlNodePtr next_local;
  
  if ((((next == (xmlNodePtr)0x0) || (next->type == XML_NAMESPACE_DECL)) || (cur == (xmlNodePtr)0x0)
      ) || ((cur->type == XML_NAMESPACE_DECL || (cur == next)))) {
    next_local = (xmlNodePtr)0x0;
  }
  else {
    next_local = cur;
    if (cur != next->prev) {
      next_local = xmlInsertNode(next->doc,cur,next->parent,next->prev,next,0);
    }
  }
  return next_local;
}

Assistant:

xmlNodePtr
xmlAddPrevSibling(xmlNodePtr next, xmlNodePtr cur) {
    if ((next == NULL) || (next->type == XML_NAMESPACE_DECL) ||
        (cur == NULL) || (cur->type == XML_NAMESPACE_DECL) ||
        (cur == next))
	return(NULL);

    if (cur == next->prev)
        return(cur);

    return(xmlInsertNode(next->doc, cur, next->parent, next->prev, next, 0));
}